

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acto.h
# Opt level: O3

void __thiscall
acto::core::message_container<msg_out,false>::message_container<char_const(&)[11]>
          (message_container<msg_out,false> *this,char (*args) [11])

{
  size_t sVar1;
  undefined8 *local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 uStack_28;
  
  local_40 = &local_30;
  sVar1 = strlen(*args);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,args,*args + sVar1);
  *(message_container<msg_out,false> **)this = this + 0x10;
  if (local_40 == &local_30) {
    *(undefined8 *)(this + 0x10) = local_30;
    *(undefined8 *)(this + 0x18) = uStack_28;
  }
  else {
    *(undefined8 **)this = local_40;
    *(undefined8 *)(this + 0x10) = local_30;
  }
  *(undefined8 *)(this + 8) = local_38;
  return;
}

Assistant:

constexpr message_container(Args&&... args) noexcept(
    std::is_nothrow_constructible_v<T, Args...>)
    : value_(std::forward<Args>(args)...) {
  }